

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O0

ssize_t __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
write(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
      *this,int __fd,void *__buf,size_t __n)

{
  element_type *peVar1;
  element_type *peVar2;
  type s;
  pointer this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  anon_class_24_2_447ba543_for_handler_ local_40;
  const_buffer local_28;
  __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
  *session_local;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  
  local_18 = (__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)CONCAT44(in_register_00000034,__fd);
  session_local =
       (shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
        *)this;
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)peVar1);
  Connection::set_timeout(peVar2,(this->config).timeout);
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)peVar1);
  s = std::
      unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>_>
      ::operator*(&peVar2->socket);
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(local_18);
  this_00 = std::
            unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
            ::operator->(&peVar1->request_streambuf);
  local_28 = (const_buffer)asio::basic_streambuf<std::allocator<char>_>::data(this_00);
  local_40.this = this;
  std::
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
  ::shared_ptr(&local_40.session,
               (shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Session>
                *)local_18);
  asio::
  async_write<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>,asio::const_buffers_1,SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::write(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Session>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
            (s,(const_buffers_1 *)&local_28,&local_40,0);
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::
  write(std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Session>const&)
  ::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
            ((_lambda_std__error_code_const__unsigned_long__1_ *)&local_40);
  return extraout_RAX;
}

Assistant:

void write(const std::shared_ptr<Session> &session) {
      session->connection->set_timeout(config.timeout);
      asio::async_write(*session->connection->socket, session->request_streambuf->data(), [this, session](const error_code &ec, std::size_t /*bytes_transferred*/) {
        auto lock = session->connection->handler_runner->continue_lock();
        if(!lock)
          return;
        if(!ec)
          this->read(session);
        else {
          if(session->connection->attempt_reconnect && ec != error::operation_aborted)
            reconnect(session, ec);
          else
            session->callback(ec);
        }
      });
    }